

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

xmlListPtr xmlListDup(xmlListPtr old)

{
  int iVar1;
  xmlListPtr cur;
  xmlListPtr pxVar2;
  
  if (old == (xmlListPtr)0x0) {
    pxVar2 = (xmlListPtr)0x0;
  }
  else {
    cur = xmlListCreate((xmlListDeallocator)0x0,old->linkCompare);
    pxVar2 = (xmlListPtr)0x0;
    if (cur != (xmlListPtr)0x0) {
      iVar1 = xmlListCopy(cur,old);
      pxVar2 = (xmlListPtr)0x0;
      if (iVar1 == 0) {
        pxVar2 = cur;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlListPtr
xmlListDup(xmlListPtr old)
{
    xmlListPtr cur;

    if (old == NULL)
        return(NULL);
    /* Hmmm, how to best deal with allocation issues when copying
     * lists. If there is a de-allocator, should responsibility lie with
     * the new list or the old list. Surely not both. I'll arbitrarily
     * set it to be the old list for the time being whilst I work out
     * the answer
     */
    cur = xmlListCreate(NULL, old->linkCompare);
    if (cur == NULL)
        return (NULL);
    if (0 != xmlListCopy(cur, old))
        return NULL;
    return cur;
}